

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O1

uint fl_utf8fromwc(char *dst,uint dstlen,wchar_t *src,uint srclen)

{
  wchar_t wVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint in_R10D;
  byte bVar9;
  
  if (dstlen == 0) {
    uVar8 = 0;
    uVar4 = 0;
  }
  else {
    uVar8 = 0;
    uVar4 = 0;
    do {
      if (uVar8 < srclen) {
        uVar6 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        wVar1 = src[uVar6];
        bVar9 = (byte)wVar1;
        if ((uint)wVar1 < 0x80) {
          uVar2 = uVar4 + 1;
          if (dstlen <= uVar2) {
            bVar9 = 0;
          }
          dst[uVar4] = bVar9;
          cVar5 = (dstlen <= uVar2) * '\x02';
          uVar4 = uVar2;
        }
        else if ((uint)wVar1 < 0x800) {
          uVar2 = uVar4 + 2;
          if (uVar2 < dstlen) {
            uVar3 = uVar4 + 1;
            dst[uVar4] = (byte)((uint)wVar1 >> 6) | 0xc0;
LAB_001fec2d:
            dst[uVar3] = bVar9 & 0x3f | 0x80;
            cVar5 = '\0';
            uVar4 = uVar2;
          }
          else {
LAB_001fec98:
            dst[uVar4] = '\0';
            cVar5 = '\x02';
            uVar4 = uVar2;
          }
        }
        else {
          if ((uint)wVar1 < 0x10000) {
            uVar6 = (ulong)(uint)wVar1;
          }
          else {
            uVar6 = 0xfffd;
            if ((uint)wVar1 < 0x110000) {
              uVar2 = uVar4 + 4;
              if (dstlen <= uVar2) goto LAB_001fec98;
              dst[uVar4] = (byte)((uint)wVar1 >> 0x12) | 0xf0;
              dst[uVar4 + 1] = (byte)((uint)wVar1 >> 0xc) & 0x3f | 0x80;
              uVar3 = uVar4 + 3;
              dst[uVar4 + 2] = (byte)((uint)wVar1 >> 6) & 0x3f | 0x80;
              goto LAB_001fec2d;
            }
          }
          uVar2 = uVar4 + 3;
          if (uVar2 < dstlen) {
            dst[uVar4] = (byte)(uVar6 >> 0xc) | 0xe0;
            dst[uVar4 + 1] = (byte)(uVar6 >> 6) & 0x3f | 0x80;
            dst[uVar4 + 2] = (byte)uVar6 & 0x3f | 0x80;
            cVar5 = '\0';
            uVar4 = uVar2;
          }
          else {
            dst[uVar4] = '\0';
            cVar5 = '\x02';
            uVar4 = uVar2;
          }
        }
      }
      else {
        dst[uVar4] = '\0';
        cVar5 = '\x01';
        in_R10D = uVar4;
      }
    } while (cVar5 == '\0');
    if (cVar5 != '\x02') {
      return in_R10D;
    }
  }
  if (uVar8 < srclen) {
    uVar6 = (ulong)uVar8;
    do {
      wVar1 = src[uVar6];
      iVar7 = 1;
      if ((0x7f < (uint)wVar1) && (iVar7 = 2, 0x7ff < (uint)wVar1)) {
        iVar7 = ((uint)(wVar1 + L'\xffff0000') < 0x100000) + 3;
      }
      uVar4 = uVar4 + iVar7;
      uVar6 = uVar6 + 1;
    } while (srclen != uVar6);
  }
  return uVar4;
}

Assistant:

unsigned fl_utf8fromwc(char* dst, unsigned dstlen,
		    const wchar_t* src, unsigned srclen) {
  unsigned i = 0;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned ucs;
    if (i >= srclen) {dst[count] = 0; return count;}
    ucs = src[i++];
    if (ucs < 0x80U) {
      dst[count++] = ucs;
      if (count >= dstlen) {dst[count-1] = 0; break;}
    } else if (ucs < 0x800U) { /* 2 bytes */
      if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
      dst[count++] = 0xc0 | (ucs >> 6);
      dst[count++] = 0x80 | (ucs & 0x3F);
#if defined(WIN32) || defined(__CYGWIN__)
    } else if (ucs >= 0xd800 && ucs <= 0xdbff && i < srclen &&
	       src[i] >= 0xdc00 && src[i] <= 0xdfff) {
      /* surrogate pair */
      unsigned ucs2 = src[i++];
      ucs = 0x10000U + ((ucs&0x3ff)<<10) + (ucs2&0x3ff);
      /* all surrogate pairs turn into 4-byte UTF-8 */
#else
    } else if (ucs >= 0x10000) {
      if (ucs > 0x10ffff) {
	ucs = 0xfffd;
	goto J1;
      }
#endif
      if (count+4 >= dstlen) {dst[count] = 0; count += 4; break;}
      dst[count++] = 0xf0 | (ucs >> 18);
      dst[count++] = 0x80 | ((ucs >> 12) & 0x3F);
      dst[count++] = 0x80 | ((ucs >> 6) & 0x3F);
      dst[count++] = 0x80 | (ucs & 0x3F);
    } else {
#if !(defined(WIN32) || defined(__CYGWIN__))
    J1:
#endif
      /* all others are 3 bytes: */
      if (count+3 >= dstlen) {dst[count] = 0; count += 3; break;}
      dst[count++] = 0xe0 | (ucs >> 12);
      dst[count++] = 0x80 | ((ucs >> 6) & 0x3F);
      dst[count++] = 0x80 | (ucs & 0x3F);
    }
  }
  /* we filled dst, measure the rest: */
  while (i < srclen) {
    unsigned ucs = src[i++];
    if (ucs < 0x80U) {
      count++;
    } else if (ucs < 0x800U) { /* 2 bytes */
      count += 2;
#if defined(WIN32) || defined(__CYGWIN__)
    } else if (ucs >= 0xd800 && ucs <= 0xdbff && i < srclen-1 &&
	       src[i+1] >= 0xdc00 && src[i+1] <= 0xdfff) {
      /* surrogate pair */
      ++i;
#else
    } else if (ucs >= 0x10000 && ucs <= 0x10ffff) {
#endif
      count += 4;
    } else {
      count += 3;
    }
  }
  return count;
}